

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O2

void __thiscall
leveldb::EnvPosixTest_TestCloseOnExecSequentialFile_Test::
EnvPosixTest_TestCloseOnExecSequentialFile_Test
          (EnvPosixTest_TestCloseOnExecSequentialFile_Test *this)

{
  EnvPosixTest::EnvPosixTest(&this->super_EnvPosixTest);
  (this->super_EnvPosixTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0014d920;
  return;
}

Assistant:

TEST_F(EnvPosixTest, TestCloseOnExecSequentialFile) {
  std::unordered_set<int> open_fds;
  GetOpenFileDescriptors(&open_fds);

  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string file_path = test_dir + "/close_on_exec_sequential.txt";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, "0123456789", file_path));

  leveldb::SequentialFile* file = nullptr;
  ASSERT_LEVELDB_OK(env_->NewSequentialFile(file_path, &file));
  CheckCloseOnExecDoesNotLeakFDs(open_fds);
  delete file;

  ASSERT_LEVELDB_OK(env_->RemoveFile(file_path));
}